

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Packing_x86::forward(Packing_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  long in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  int i_9;
  float *outptr1_5;
  float *outptr0_5;
  float *r0_11;
  int q_5;
  int i_8;
  float *outptr_5;
  float *r1_5;
  float *r0_10;
  int q_4;
  int remain_3;
  float *outptr7_1;
  float *outptr6_1;
  float *outptr5_1;
  float *outptr4_1;
  float *outptr3_3;
  float *outptr2_3;
  float *outptr1_4;
  float *outptr0_4;
  float *r0_9;
  int q_3;
  int remain_2;
  float *outptr_4;
  float *r7_1;
  float *r6_1;
  float *r5_1;
  float *r4_1;
  float *r3_3;
  float *r2_3;
  float *r1_4;
  float *r0_8;
  int q_2;
  int i_7;
  float *outptr3_2;
  float *outptr2_2;
  float *outptr1_3;
  float *outptr0_3;
  float *r0_7;
  int q_1;
  int i_6;
  float *outptr_3;
  float *r3_2;
  float *r2_2;
  float *r1_3;
  float *r0_6;
  int q;
  size_t out_elemsize_1;
  int outc;
  int size;
  int j_3;
  float *outptr1_2;
  float *outptr0_2;
  float *r0_5;
  int i_5;
  int j_2;
  float *outptr_2;
  float *r1_2;
  float *r0_4;
  int i_4;
  int remain_1;
  float *outptr7;
  float *outptr6;
  float *outptr5;
  float *outptr4;
  float *outptr3_1;
  float *outptr2_1;
  float *outptr1_1;
  float *outptr0_1;
  float *r0_3;
  int i_3;
  int remain;
  float *outptr_1;
  float *r7;
  float *r6;
  float *r5;
  float *r4;
  float *r3_1;
  float *r2_1;
  float *r1_1;
  float *r0_2;
  int i_2;
  int j_1;
  float *outptr3;
  float *outptr2;
  float *outptr1;
  float *outptr0;
  float *r0_1;
  int i_1;
  int j;
  float *outptr;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  int i;
  size_t out_elemsize;
  int outh;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  bool pack8to4;
  bool pack4to8;
  bool pack8to1;
  bool pack1to8;
  bool pack4to1;
  bool pack1to4;
  int elempack;
  size_t elemsize;
  int elembits;
  Mat *in_stack_fffffffffffff120;
  Mat *in_stack_fffffffffffff128;
  Mat *pMVar4;
  size_t in_stack_fffffffffffff130;
  int _d;
  int iVar5;
  undefined8 in_stack_fffffffffffff138;
  int _w;
  Mat *in_stack_fffffffffffff140;
  Mat *in_stack_fffffffffffff148;
  Mat *pMVar6;
  Allocator *in_stack_fffffffffffff150;
  Allocator *in_stack_fffffffffffff158;
  bool local_cb6;
  bool local_cb5;
  bool local_cb4;
  bool local_cb3;
  bool local_cb2;
  bool local_cb1;
  int local_ca4;
  Mat local_ca0;
  float *local_c58;
  Option *in_stack_fffffffffffff3c0;
  Mat *in_stack_fffffffffffff3c8;
  Mat *in_stack_fffffffffffff3d0;
  Packing *in_stack_fffffffffffff3d8;
  Mat *local_c08;
  Mat local_c00;
  float *local_bb8;
  int local_bb0;
  int local_bac;
  Mat local_ba8;
  float *local_b60;
  Mat local_b58;
  float *local_b10;
  Mat local_b08;
  float *local_ac0;
  int local_ab8;
  int local_ab4;
  Mat local_ab0;
  float *local_a68;
  Mat local_a60;
  float *local_a18;
  Mat local_a10;
  float *local_9c8;
  Mat local_9c0;
  float *local_978;
  Mat local_970;
  float *local_928;
  Mat local_920;
  float *local_8d8;
  Mat local_8d0;
  float *local_888;
  Mat local_880;
  float *local_838;
  Mat local_830;
  float *local_7e8;
  int local_7e0;
  int local_7dc;
  Mat local_7d8;
  float *local_790;
  Mat local_788;
  float *local_740;
  Option *in_stack_fffffffffffff900;
  Mat *in_stack_fffffffffffff908;
  Mat *in_stack_fffffffffffff910;
  Packing_x86 *in_stack_fffffffffffff918;
  float *local_6a0;
  Mat local_698;
  float *local_650;
  Mat local_648;
  float *local_600;
  Mat local_5f8;
  float *local_5b0;
  Mat local_5a8;
  float *local_560;
  Mat local_558;
  float *local_510;
  int local_508;
  int local_504;
  Mat local_500;
  float *local_4b8;
  Mat local_4b0;
  float *local_468;
  Mat local_460;
  float *local_418;
  Mat local_410;
  float *local_3c8;
  Mat local_3c0;
  float *local_378;
  int local_370;
  int local_36c;
  Mat local_368;
  float *local_320;
  Mat local_318;
  float *local_2d0;
  Mat local_2c8;
  float *local_280;
  Mat local_278;
  float *local_230;
  Mat local_218;
  float *local_1d0;
  int local_1c4;
  long local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  float *local_1a8;
  float *local_1a0;
  float *local_198;
  int local_190;
  int local_18c;
  float *local_188;
  float *local_180;
  float *local_178;
  int local_170;
  int local_16c;
  float *local_168;
  float *local_160;
  float *local_158;
  float *local_150;
  float *local_148;
  float *local_140;
  float *local_138;
  float *local_130;
  float *local_128;
  int local_120;
  int local_11c;
  float *local_118;
  float *local_110;
  float *local_108;
  float *local_100;
  float *local_f8;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  int local_d0;
  int local_cc;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float *local_b0;
  float *local_a8;
  int local_a0;
  int local_9c;
  float *local_98;
  float *local_90;
  float *local_88;
  float *local_80;
  float *local_78;
  int local_6c;
  long local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  bool local_42;
  bool local_41;
  bool local_40;
  bool local_3f;
  bool local_3e;
  bool local_3d;
  int local_3c;
  ulong local_38;
  int local_2c;
  long local_28;
  Mat *local_20;
  Mat *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_2c = ncnn::Mat::elembits(in_RSI);
  if (local_2c == 8) {
    local_4 = forward_int8(in_stack_fffffffffffff918,in_stack_fffffffffffff910,
                           in_stack_fffffffffffff908,in_stack_fffffffffffff900);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
    if (local_2c == 0x20) {
      local_38 = local_18->elemsize;
      local_3c = local_18->elempack;
      if (local_3c == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)) {
        ncnn::Mat::operator=(in_stack_fffffffffffff128,in_stack_fffffffffffff120);
        local_4 = 0;
      }
      else {
        local_cb1 = false;
        if (local_3c == 1) {
          local_cb1 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 4;
        }
        local_3d = local_cb1;
        local_cb2 = false;
        if (local_3c == 4) {
          local_cb2 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1;
        }
        local_3e = local_cb2;
        local_cb3 = false;
        if (local_3c == 1) {
          local_cb3 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 8;
        }
        local_3f = local_cb3;
        local_cb4 = false;
        if (local_3c == 8) {
          local_cb4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 1;
        }
        local_40 = local_cb4;
        local_cb5 = false;
        if (local_3c == 4) {
          local_cb5 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 8;
        }
        local_41 = local_cb5;
        local_cb6 = false;
        if (local_3c == 8) {
          local_cb6 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) == 4;
        }
        local_42 = local_cb6;
        if ((((local_cb1 == false) && (local_cb2 == false)) && (local_cb3 == false)) &&
           (((local_cb4 == false && (local_cb5 == false)) && (local_cb6 == false)))) {
          local_4 = Packing::forward(in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                                     in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
        }
        else {
          local_48 = local_18->w;
          local_4c = local_18->h;
          local_50 = local_18->d;
          local_54 = local_18->c;
          local_58 = local_18->dims;
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
            if ((local_58 == 1) &&
               ((local_48 * local_3c) % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
                != 0)) {
              ncnn::Mat::operator=(in_stack_fffffffffffff128,in_stack_fffffffffffff120);
              return 0;
            }
            if ((local_58 == 2) &&
               ((local_4c * local_3c) % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
                != 0)) {
              ncnn::Mat::operator=(in_stack_fffffffffffff128,in_stack_fffffffffffff120);
              return 0;
            }
            if (((local_58 == 3) || (local_58 == 4)) &&
               ((local_54 * local_3c) % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
                != 0)) {
              ncnn::Mat::operator=(in_stack_fffffffffffff128,in_stack_fffffffffffff120);
              return 0;
            }
          }
          if (local_58 == 1) {
            ncnn::Mat::operator=(in_stack_fffffffffffff128,in_stack_fffffffffffff120);
            local_20->w = (local_48 * local_3c) /
                          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_20->cstep =
                 (long)((local_48 * local_3c) /
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
            local_20->elemsize =
                 (local_38 / (ulong)(long)local_3c) *
                 (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_20->elempack = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_4 = 0;
          }
          else {
            iVar5 = (int)in_stack_fffffffffffff138;
            _w = (int)((ulong)in_stack_fffffffffffff138 >> 0x20);
            if (local_58 == 2) {
              local_5c = (local_4c * local_3c) /
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
              local_68 = (local_38 / (ulong)(long)local_3c) *
                         (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
              ncnn::Mat::create(in_stack_fffffffffffff140,_w,iVar5,in_stack_fffffffffffff130,
                                (int)((ulong)in_stack_fffffffffffff128 >> 0x20),
                                (Allocator *)in_stack_fffffffffffff120);
              bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff120);
              if (bVar1) {
                local_4 = -100;
              }
              else {
                if ((local_3d & 1U) != 0) {
                  for (local_6c = 0; local_6c < local_5c; local_6c = local_6c + 1) {
                    local_78 = ncnn::Mat::row(local_18,local_6c << 2);
                    local_80 = ncnn::Mat::row(local_18,local_6c * 4 + 1);
                    local_88 = ncnn::Mat::row(local_18,local_6c * 4 + 2);
                    local_90 = ncnn::Mat::row(local_18,local_6c * 4 + 3);
                    local_98 = ncnn::Mat::row(local_20,local_6c);
                    for (local_9c = 0; local_9c < local_48; local_9c = local_9c + 1) {
                      *local_98 = *local_78;
                      local_98[1] = *local_80;
                      local_98[2] = *local_88;
                      local_98[3] = *local_90;
                      local_98 = local_98 + 4;
                      local_90 = local_90 + 1;
                      local_88 = local_88 + 1;
                      local_80 = local_80 + 1;
                      local_78 = local_78 + 1;
                    }
                  }
                }
                if ((local_3e & 1U) != 0) {
                  for (local_a0 = 0; local_a0 < local_4c; local_a0 = local_a0 + 1) {
                    local_a8 = ncnn::Mat::row(local_18,local_a0);
                    local_b0 = ncnn::Mat::row(local_20,local_a0 << 2);
                    local_b8 = ncnn::Mat::row(local_20,local_a0 * 4 + 1);
                    local_c0 = ncnn::Mat::row(local_20,local_a0 * 4 + 2);
                    local_c8 = ncnn::Mat::row(local_20,local_a0 * 4 + 3);
                    for (local_cc = 0; local_cc < local_48; local_cc = local_cc + 1) {
                      *local_b0 = *local_a8;
                      *local_b8 = local_a8[1];
                      *local_c0 = local_a8[2];
                      *local_c8 = local_a8[3];
                      local_a8 = local_a8 + 4;
                      local_c8 = local_c8 + 1;
                      local_c0 = local_c0 + 1;
                      local_b8 = local_b8 + 1;
                      local_b0 = local_b0 + 1;
                    }
                  }
                }
                if ((local_3f & 1U) != 0) {
                  for (local_d0 = 0; local_d0 < local_5c; local_d0 = local_d0 + 1) {
                    local_d8 = ncnn::Mat::row(local_18,local_d0 << 3);
                    local_e0 = ncnn::Mat::row(local_18,local_d0 * 8 + 1);
                    local_e8 = ncnn::Mat::row(local_18,local_d0 * 8 + 2);
                    local_f0 = ncnn::Mat::row(local_18,local_d0 * 8 + 3);
                    local_f8 = ncnn::Mat::row(local_18,local_d0 * 8 + 4);
                    local_100 = ncnn::Mat::row(local_18,local_d0 * 8 + 5);
                    local_108 = ncnn::Mat::row(local_18,local_d0 * 8 + 6);
                    local_110 = ncnn::Mat::row(local_18,local_d0 * 8 + 7);
                    local_118 = ncnn::Mat::row(local_20,local_d0);
                    for (local_11c = local_48; 0 < local_11c; local_11c = local_11c + -1) {
                      *local_118 = *local_d8;
                      local_118[1] = *local_e0;
                      local_118[2] = *local_e8;
                      local_118[3] = *local_f0;
                      local_118[4] = *local_f8;
                      local_118[5] = *local_100;
                      local_118[6] = *local_108;
                      local_118[7] = *local_110;
                      local_118 = local_118 + 8;
                      local_110 = local_110 + 1;
                      local_108 = local_108 + 1;
                      local_100 = local_100 + 1;
                      local_f8 = local_f8 + 1;
                      local_f0 = local_f0 + 1;
                      local_e8 = local_e8 + 1;
                      local_e0 = local_e0 + 1;
                      local_d8 = local_d8 + 1;
                    }
                  }
                }
                if ((local_40 & 1U) != 0) {
                  for (local_120 = 0; local_120 < local_4c; local_120 = local_120 + 1) {
                    local_128 = ncnn::Mat::row(local_18,local_120);
                    local_130 = ncnn::Mat::row(local_20,local_120 << 3);
                    local_138 = ncnn::Mat::row(local_20,local_120 * 8 + 1);
                    local_140 = ncnn::Mat::row(local_20,local_120 * 8 + 2);
                    local_148 = ncnn::Mat::row(local_20,local_120 * 8 + 3);
                    local_150 = ncnn::Mat::row(local_20,local_120 * 8 + 4);
                    local_158 = ncnn::Mat::row(local_20,local_120 * 8 + 5);
                    local_160 = ncnn::Mat::row(local_20,local_120 * 8 + 6);
                    local_168 = ncnn::Mat::row(local_20,local_120 * 8 + 7);
                    for (local_16c = local_48; 0 < local_16c; local_16c = local_16c + -1) {
                      *local_130 = *local_128;
                      *local_138 = local_128[1];
                      *local_140 = local_128[2];
                      *local_148 = local_128[3];
                      *local_150 = local_128[4];
                      *local_158 = local_128[5];
                      *local_160 = local_128[6];
                      *local_168 = local_128[7];
                      local_128 = local_128 + 8;
                      local_168 = local_168 + 1;
                      local_160 = local_160 + 1;
                      local_158 = local_158 + 1;
                      local_150 = local_150 + 1;
                      local_148 = local_148 + 1;
                      local_140 = local_140 + 1;
                      local_138 = local_138 + 1;
                      local_130 = local_130 + 1;
                    }
                  }
                }
                if ((local_41 & 1U) != 0) {
                  for (local_170 = 0; local_170 < local_5c; local_170 = local_170 + 1) {
                    local_178 = ncnn::Mat::row(local_18,local_170 << 1);
                    local_180 = ncnn::Mat::row(local_18,local_170 * 2 + 1);
                    local_188 = ncnn::Mat::row(local_20,local_170);
                    for (local_18c = 0; local_18c < local_48; local_18c = local_18c + 1) {
                      *local_188 = *local_178;
                      local_188[1] = local_178[1];
                      local_188[2] = local_178[2];
                      local_188[3] = local_178[3];
                      local_188[4] = *local_180;
                      local_188[5] = local_180[1];
                      local_188[6] = local_180[2];
                      local_188[7] = local_180[3];
                      local_178 = local_178 + 4;
                      local_180 = local_180 + 4;
                      local_188 = local_188 + 8;
                    }
                  }
                }
                if ((local_42 & 1U) != 0) {
                  for (local_190 = 0; local_190 < local_4c; local_190 = local_190 + 1) {
                    local_198 = ncnn::Mat::row(local_18,local_190);
                    local_1a0 = ncnn::Mat::row(local_20,local_190 << 1);
                    local_1a8 = ncnn::Mat::row(local_20,local_190 * 2 + 1);
                    for (local_1ac = 0; local_1ac < local_48; local_1ac = local_1ac + 1) {
                      *local_1a0 = *local_198;
                      local_1a0[1] = local_198[1];
                      local_1a0[2] = local_198[2];
                      local_1a0[3] = local_198[3];
                      *local_1a8 = local_198[4];
                      local_1a8[1] = local_198[5];
                      local_1a8[2] = local_198[6];
                      local_1a8[3] = local_198[7];
                      local_198 = local_198 + 8;
                      local_1a0 = local_1a0 + 4;
                      local_1a8 = local_1a8 + 4;
                    }
                  }
                }
                local_4 = 0;
              }
            }
            else if ((local_58 == 3) || (local_58 == 4)) {
              local_1b0 = local_48 * local_4c * local_50;
              local_1b4 = (local_54 * local_3c) /
                          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
              local_1c0 = (local_38 / (ulong)(long)local_3c) *
                          (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
              _d = (int)(in_stack_fffffffffffff130 >> 0x20);
              if (local_58 == 3) {
                ncnn::Mat::create(in_stack_fffffffffffff140,_w,iVar5,_d,
                                  (size_t)in_stack_fffffffffffff128,
                                  (int)((ulong)in_stack_fffffffffffff120 >> 0x20),
                                  in_stack_fffffffffffff150);
              }
              else {
                in_stack_fffffffffffff120 = *(Mat **)(local_28 + 8);
                ncnn::Mat::create(in_stack_fffffffffffff140,_w,iVar5,_d,
                                  (int)in_stack_fffffffffffff130,(size_t)in_stack_fffffffffffff128,
                                  (int)in_stack_fffffffffffff150,in_stack_fffffffffffff158);
              }
              bVar1 = ncnn::Mat::empty(in_stack_fffffffffffff120);
              if (bVar1) {
                local_4 = -100;
              }
              else {
                if ((local_3d & 1U) != 0) {
                  for (local_1c4 = 0; local_1c4 < local_1b4; local_1c4 = local_1c4 + 1) {
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_218);
                    ncnn::Mat::~Mat((Mat *)0x6fc935);
                    local_1d0 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_278);
                    ncnn::Mat::~Mat((Mat *)0x6fc996);
                    local_230 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_2c8);
                    ncnn::Mat::~Mat((Mat *)0x6fc9f7);
                    local_280 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_318);
                    ncnn::Mat::~Mat((Mat *)0x6fca58);
                    local_2d0 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_368);
                    ncnn::Mat::~Mat((Mat *)0x6fcab0);
                    local_320 = pfVar2;
                    for (local_36c = 0; local_36c < local_1b0; local_36c = local_36c + 1) {
                      *local_320 = *local_1d0;
                      local_320[1] = *local_230;
                      local_320[2] = *local_280;
                      local_320[3] = *local_2d0;
                      local_320 = local_320 + 4;
                      local_2d0 = local_2d0 + 1;
                      local_280 = local_280 + 1;
                      local_230 = local_230 + 1;
                      local_1d0 = local_1d0 + 1;
                    }
                  }
                }
                if ((local_3e & 1U) != 0) {
                  for (local_370 = 0; local_370 < local_54; local_370 = local_370 + 1) {
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_3c0);
                    ncnn::Mat::~Mat((Mat *)0x6fccf5);
                    local_378 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_410);
                    ncnn::Mat::~Mat((Mat *)0x6fcd50);
                    local_3c8 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_460);
                    ncnn::Mat::~Mat((Mat *)0x6fcdb1);
                    local_418 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_4b0);
                    ncnn::Mat::~Mat((Mat *)0x6fce12);
                    local_468 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_500);
                    ncnn::Mat::~Mat((Mat *)0x6fce73);
                    local_4b8 = pfVar2;
                    for (local_504 = 0; local_504 < local_1b0; local_504 = local_504 + 1) {
                      *local_3c8 = *local_378;
                      *local_418 = local_378[1];
                      *local_468 = local_378[2];
                      *local_4b8 = local_378[3];
                      local_378 = local_378 + 4;
                      local_4b8 = local_4b8 + 1;
                      local_468 = local_468 + 1;
                      local_418 = local_418 + 1;
                      local_3c8 = local_3c8 + 1;
                    }
                  }
                }
                if ((local_3f & 1U) != 0) {
                  for (local_508 = 0; local_508 < local_1b4; local_508 = local_508 + 1) {
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_558);
                    ncnn::Mat::~Mat((Mat *)0x6fd0bb);
                    local_510 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_5a8);
                    ncnn::Mat::~Mat((Mat *)0x6fd11c);
                    local_560 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_5f8);
                    ncnn::Mat::~Mat((Mat *)0x6fd17d);
                    local_5b0 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_648);
                    ncnn::Mat::~Mat((Mat *)0x6fd1de);
                    local_600 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_698);
                    ncnn::Mat::~Mat((Mat *)0x6fd23f);
                    local_650 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    local_6a0 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffff918);
                    ncnn::Mat::~Mat((Mat *)0x6fd2a0);
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffff8c8);
                    ncnn::Mat::~Mat((Mat *)0x6fd301);
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_788);
                    ncnn::Mat::~Mat((Mat *)0x6fd362);
                    local_740 = pfVar3;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar3 = ncnn::Mat::operator_cast_to_float_(&local_7d8);
                    ncnn::Mat::~Mat((Mat *)0x6fd3ba);
                    local_790 = pfVar3;
                    for (local_7dc = local_1b0; 0 < local_7dc; local_7dc = local_7dc + -1) {
                      *local_790 = *local_510;
                      local_790[1] = *local_560;
                      local_790[2] = *local_5b0;
                      local_790[3] = *local_600;
                      local_790[4] = *local_650;
                      local_790[5] = *local_6a0;
                      local_790[6] = *pfVar2;
                      local_790[7] = *local_740;
                      local_790 = local_790 + 8;
                      local_740 = local_740 + 1;
                      pfVar2 = pfVar2 + 1;
                      local_6a0 = local_6a0 + 1;
                      local_650 = local_650 + 1;
                      local_600 = local_600 + 1;
                      local_5b0 = local_5b0 + 1;
                      local_560 = local_560 + 1;
                      local_510 = local_510 + 1;
                    }
                  }
                }
                if ((local_40 & 1U) != 0) {
                  for (local_7e0 = 0; local_7e0 < local_54; local_7e0 = local_7e0 + 1) {
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_830);
                    ncnn::Mat::~Mat((Mat *)0x6fd734);
                    local_7e8 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_880);
                    ncnn::Mat::~Mat((Mat *)0x6fd78f);
                    local_838 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_8d0);
                    ncnn::Mat::~Mat((Mat *)0x6fd7f0);
                    local_888 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_920);
                    ncnn::Mat::~Mat((Mat *)0x6fd851);
                    local_8d8 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_970);
                    ncnn::Mat::~Mat((Mat *)0x6fd8b2);
                    local_928 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_9c0);
                    ncnn::Mat::~Mat((Mat *)0x6fd913);
                    local_978 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_a10);
                    ncnn::Mat::~Mat((Mat *)0x6fd974);
                    local_9c8 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_a60);
                    ncnn::Mat::~Mat((Mat *)0x6fd9d5);
                    local_a18 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_ab0);
                    ncnn::Mat::~Mat((Mat *)0x6fda2d);
                    local_a68 = pfVar2;
                    for (local_ab4 = local_1b0; 0 < local_ab4; local_ab4 = local_ab4 + -1) {
                      *local_838 = *local_7e8;
                      *local_888 = local_7e8[1];
                      *local_8d8 = local_7e8[2];
                      *local_928 = local_7e8[3];
                      *local_978 = local_7e8[4];
                      *local_9c8 = local_7e8[5];
                      *local_a18 = local_7e8[6];
                      *local_a68 = local_7e8[7];
                      local_7e8 = local_7e8 + 8;
                      local_a68 = local_a68 + 1;
                      local_a18 = local_a18 + 1;
                      local_9c8 = local_9c8 + 1;
                      local_978 = local_978 + 1;
                      local_928 = local_928 + 1;
                      local_8d8 = local_8d8 + 1;
                      local_888 = local_888 + 1;
                      local_838 = local_838 + 1;
                    }
                  }
                }
                if ((local_41 & 1U) != 0) {
                  for (local_ab8 = 0; local_ab8 < local_1b4; local_ab8 = local_ab8 + 1) {
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_b08);
                    ncnn::Mat::~Mat((Mat *)0x6fdd9d);
                    local_ac0 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(&local_b58);
                    ncnn::Mat::~Mat((Mat *)0x6fddef);
                    pMVar6 = &local_ba8;
                    local_b10 = pfVar2;
                    ncnn::Mat::channel(in_stack_fffffffffffff148,
                                       (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(pMVar6);
                    ncnn::Mat::~Mat((Mat *)0x6fde3b);
                    local_b60 = pfVar2;
                    for (local_bac = 0; local_bac < local_1b0; local_bac = local_bac + 1) {
                      *local_b60 = *local_ac0;
                      local_b60[1] = local_ac0[1];
                      local_b60[2] = local_ac0[2];
                      local_b60[3] = local_ac0[3];
                      local_b60[4] = *local_b10;
                      local_b60[5] = local_b10[1];
                      local_b60[6] = local_b10[2];
                      local_b60[7] = local_b10[3];
                      local_ac0 = local_ac0 + 4;
                      local_b10 = local_b10 + 4;
                      local_b60 = local_b60 + 8;
                    }
                  }
                }
                if ((local_42 & 1U) != 0) {
                  for (local_bb0 = 0; iVar5 = (int)((ulong)in_stack_fffffffffffff140 >> 0x20),
                      local_bb0 < local_54; local_bb0 = local_bb0 + 1) {
                    pMVar6 = &local_c00;
                    ncnn::Mat::channel(pMVar6,iVar5);
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(pMVar6);
                    ncnn::Mat::~Mat((Mat *)0x6fe07e);
                    pMVar4 = (Mat *)&stack0xfffffffffffff3b0;
                    local_bb8 = pfVar2;
                    ncnn::Mat::channel(pMVar6,iVar5);
                    local_c08 = (Mat *)ncnn::Mat::operator_cast_to_float_(pMVar4);
                    ncnn::Mat::~Mat((Mat *)0x6fe0cc);
                    pMVar4 = &local_ca0;
                    in_stack_fffffffffffff140 = local_c08;
                    ncnn::Mat::channel(pMVar6,(int)((ulong)local_c08 >> 0x20));
                    pfVar2 = ncnn::Mat::operator_cast_to_float_(pMVar4);
                    ncnn::Mat::~Mat((Mat *)0x6fe11e);
                    local_c58 = pfVar2;
                    for (local_ca4 = 0; local_ca4 < local_1b0; local_ca4 = local_ca4 + 1) {
                      *(float *)&local_c08->data = *local_bb8;
                      *(float *)((long)&local_c08->data + 4) = local_bb8[1];
                      *(float *)&local_c08->refcount = local_bb8[2];
                      *(float *)((long)&local_c08->refcount + 4) = local_bb8[3];
                      *local_c58 = local_bb8[4];
                      local_c58[1] = local_bb8[5];
                      local_c58[2] = local_bb8[6];
                      local_c58[3] = local_bb8[7];
                      local_bb8 = local_bb8 + 8;
                      local_c08 = (Mat *)&local_c08->elemsize;
                      local_c58 = local_c58 + 4;
                    }
                  }
                }
                local_4 = 0;
              }
            }
            else {
              local_4 = 0;
            }
          }
        }
      }
    }
    else {
      local_4 = Packing::forward(in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                                 in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
    }
  }
  else {
    local_4 = Packing::forward(in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,
                               in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
  }
  return local_4;
}

Assistant:

int Packing_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    if (use_padding)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    if (elembits != 32)
    {
        // non-fp32 type
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    bool pack1to4 = elempack == 1 && out_elempack == 4;
    bool pack4to1 = elempack == 4 && out_elempack == 1;
    bool pack1to8 = elempack == 1 && out_elempack == 8;
    bool pack8to1 = elempack == 8 && out_elempack == 1;
    bool pack4to8 = elempack == 4 && out_elempack == 8;
    bool pack8to4 = elempack == 8 && out_elempack == 4;

    if (!pack1to4 && !pack4to1 && !pack1to8 && !pack8to1 && !pack4to8 && !pack8to4)
    {
        return Packing::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        top_blob = bottom_blob;
        top_blob.w = w * elempack / out_elempack;
        top_blob.cstep = w * elempack / out_elempack;
        top_blob.elemsize = elemsize / elempack * out_elempack;
        top_blob.elempack = out_elempack;
        return 0;
    }

    if (dims == 2)
    {
        int outh = h * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 4);
                const float* r1 = bottom_blob.row(i * 4 + 1);
                const float* r2 = bottom_blob.row(i * 4 + 2);
                const float* r3 = bottom_blob.row(i * 4 + 3);

                float* outptr = top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;

                    outptr += 4;
                }
            }
        }
        if (pack4to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 4);
                float* outptr1 = top_blob.row(i * 4 + 1);
                float* outptr2 = top_blob.row(i * 4 + 2);
                float* outptr3 = top_blob.row(i * 4 + 3);

                for (int j = 0; j < w; j++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];

                    r0 += 4;
                }
            }
        }
        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 8);
                const float* r1 = bottom_blob.row(i * 8 + 1);
                const float* r2 = bottom_blob.row(i * 8 + 2);
                const float* r3 = bottom_blob.row(i * 8 + 3);
                const float* r4 = bottom_blob.row(i * 8 + 4);
                const float* r5 = bottom_blob.row(i * 8 + 5);
                const float* r6 = bottom_blob.row(i * 8 + 6);
                const float* r7 = bottom_blob.row(i * 8 + 7);

                float* outptr = top_blob.row(i);

#if __AVX__
                int nn = w >> 3;
                int remain = w & 7;
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r1);
                    __m256 _row2 = _mm256_loadu_ps(r2);
                    __m256 _row3 = _mm256_loadu_ps(r3);
                    __m256 _row4 = _mm256_loadu_ps(r4);
                    __m256 _row5 = _mm256_loadu_ps(r5);
                    __m256 _row6 = _mm256_loadu_ps(r6);
                    __m256 _row7 = _mm256_loadu_ps(r7);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    r3 += 8;
                    r4 += 8;
                    r5 += 8;
                    r6 += 8;
                    r7 += 8;
                    outptr += 64;
                }
#else
                int remain = w;
#endif

                for (; remain > 0; remain--)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 8);
                float* outptr1 = top_blob.row(i * 8 + 1);
                float* outptr2 = top_blob.row(i * 8 + 2);
                float* outptr3 = top_blob.row(i * 8 + 3);
                float* outptr4 = top_blob.row(i * 8 + 4);
                float* outptr5 = top_blob.row(i * 8 + 5);
                float* outptr6 = top_blob.row(i * 8 + 6);
                float* outptr7 = top_blob.row(i * 8 + 7);
#if __AVX__
                int nn = w >> 3;
                int remain = w & 7;
#else
                int remain = w;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r0 + 8);
                    __m256 _row2 = _mm256_loadu_ps(r0 + 16);
                    __m256 _row3 = _mm256_loadu_ps(r0 + 24);
                    __m256 _row4 = _mm256_loadu_ps(r0 + 32);
                    __m256 _row5 = _mm256_loadu_ps(r0 + 40);
                    __m256 _row6 = _mm256_loadu_ps(r0 + 48);
                    __m256 _row7 = _mm256_loadu_ps(r0 + 56);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    r0 += 64;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                }
#endif
                for (; remain > 0; remain--)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }
        if (pack4to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* r0 = bottom_blob.row(i * 2);
                const float* r1 = bottom_blob.row(i * 2 + 1);

                float* outptr = top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    outptr[0] = r0[0];
                    outptr[1] = r0[1];
                    outptr[2] = r0[2];
                    outptr[3] = r0[3];
                    outptr[4] = r1[0];
                    outptr[5] = r1[1];
                    outptr[6] = r1[2];
                    outptr[7] = r1[3];

                    r0 += 4;
                    r1 += 4;
                    outptr += 8;
                }
            }
        }
        if (pack8to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* r0 = bottom_blob.row(i);

                float* outptr0 = top_blob.row(i * 2);
                float* outptr1 = top_blob.row(i * 2 + 1);

                for (int j = 0; j < w; j++)
                {
                    outptr0[0] = r0[0];
                    outptr0[1] = r0[1];
                    outptr0[2] = r0[2];
                    outptr0[3] = r0[3];
                    outptr1[0] = r0[4];
                    outptr1[1] = r0[5];
                    outptr1[2] = r0[6];
                    outptr1[3] = r0[7];

                    r0 += 8;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int size = w * h * d;
        int outc = channels * elempack / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3)
            top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        else // if (dims == 4)
            top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pack1to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 4);
                const float* r1 = bottom_blob.channel(q * 4 + 1);
                const float* r2 = bottom_blob.channel(q * 4 + 2);
                const float* r3 = bottom_blob.channel(q * 4 + 3);

                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;

                    outptr += 4;
                }
            }
        }
        if (pack4to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 4);
                float* outptr1 = top_blob.channel(q * 4 + 1);
                float* outptr2 = top_blob.channel(q * 4 + 2);
                float* outptr3 = top_blob.channel(q * 4 + 3);

                for (int i = 0; i < size; i++)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];

                    r0 += 4;
                }
            }
        }
        if (pack1to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 8);
                const float* r1 = bottom_blob.channel(q * 8 + 1);
                const float* r2 = bottom_blob.channel(q * 8 + 2);
                const float* r3 = bottom_blob.channel(q * 8 + 3);
                const float* r4 = bottom_blob.channel(q * 8 + 4);
                const float* r5 = bottom_blob.channel(q * 8 + 5);
                const float* r6 = bottom_blob.channel(q * 8 + 6);
                const float* r7 = bottom_blob.channel(q * 8 + 7);

                float* outptr = top_blob.channel(q);

#if __AVX__
                int nn = size >> 3;
                int remain = size & 7;
#else
                int remain = size;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r1);
                    __m256 _row2 = _mm256_loadu_ps(r2);
                    __m256 _row3 = _mm256_loadu_ps(r3);
                    __m256 _row4 = _mm256_loadu_ps(r4);
                    __m256 _row5 = _mm256_loadu_ps(r5);
                    __m256 _row6 = _mm256_loadu_ps(r6);
                    __m256 _row7 = _mm256_loadu_ps(r7);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    r3 += 8;
                    r4 += 8;
                    r5 += 8;
                    r6 += 8;
                    r7 += 8;
                    outptr += 64;
                }
#endif
                for (; remain > 0; remain--)
                {
                    outptr[0] = *r0++;
                    outptr[1] = *r1++;
                    outptr[2] = *r2++;
                    outptr[3] = *r3++;
                    outptr[4] = *r4++;
                    outptr[5] = *r5++;
                    outptr[6] = *r6++;
                    outptr[7] = *r7++;

                    outptr += 8;
                }
            }
        }
        if (pack8to1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 8);
                float* outptr1 = top_blob.channel(q * 8 + 1);
                float* outptr2 = top_blob.channel(q * 8 + 2);
                float* outptr3 = top_blob.channel(q * 8 + 3);
                float* outptr4 = top_blob.channel(q * 8 + 4);
                float* outptr5 = top_blob.channel(q * 8 + 5);
                float* outptr6 = top_blob.channel(q * 8 + 6);
                float* outptr7 = top_blob.channel(q * 8 + 7);
#if __AVX__
                int nn = size >> 3;
                int remain = size & 7;
#else
                int remain = size;
#endif

#if __AVX__
                for (; nn > 0; nn--)
                {
                    __m256 _row0 = _mm256_loadu_ps(r0);
                    __m256 _row1 = _mm256_loadu_ps(r0 + 8);
                    __m256 _row2 = _mm256_loadu_ps(r0 + 16);
                    __m256 _row3 = _mm256_loadu_ps(r0 + 24);
                    __m256 _row4 = _mm256_loadu_ps(r0 + 32);
                    __m256 _row5 = _mm256_loadu_ps(r0 + 40);
                    __m256 _row6 = _mm256_loadu_ps(r0 + 48);
                    __m256 _row7 = _mm256_loadu_ps(r0 + 56);
                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);
                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    r0 += 64;
                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                }
#endif

                for (; remain > 0; remain--)
                {
                    *outptr0++ = r0[0];
                    *outptr1++ = r0[1];
                    *outptr2++ = r0[2];
                    *outptr3++ = r0[3];
                    *outptr4++ = r0[4];
                    *outptr5++ = r0[5];
                    *outptr6++ = r0[6];
                    *outptr7++ = r0[7];

                    r0 += 8;
                }
            }
        }
        if (pack4to8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* r0 = bottom_blob.channel(q * 2);
                const float* r1 = bottom_blob.channel(q * 2 + 1);

                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[0] = r0[0];
                    outptr[1] = r0[1];
                    outptr[2] = r0[2];
                    outptr[3] = r0[3];
                    outptr[4] = r1[0];
                    outptr[5] = r1[1];
                    outptr[6] = r1[2];
                    outptr[7] = r1[3];

                    r0 += 4;
                    r1 += 4;
                    outptr += 8;
                }
            }
        }
        if (pack8to4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* r0 = bottom_blob.channel(q);

                float* outptr0 = top_blob.channel(q * 2);
                float* outptr1 = top_blob.channel(q * 2 + 1);

                for (int i = 0; i < size; i++)
                {
                    outptr0[0] = r0[0];
                    outptr0[1] = r0[1];
                    outptr0[2] = r0[2];
                    outptr0[3] = r0[3];
                    outptr1[0] = r0[4];
                    outptr1[1] = r0[5];
                    outptr1[2] = r0[6];
                    outptr1[3] = r0[7];

                    r0 += 8;
                    outptr0 += 4;
                    outptr1 += 4;
                }
            }
        }

        return 0;
    }

    return 0;
}